

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int Map_IncreaseStorageKeysValues(MAP_HANDLE_DATA *handleData)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char **ppcVar4;
  LOGGER_LOG p_Var5;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  ulong local_70;
  size_t local_68;
  size_t local_60;
  ulong local_58;
  LOGGER_LOG l_2;
  char **undoneKeys;
  LOGGER_LOG l_1;
  char **newValues;
  LOGGER_LOG l;
  size_t realloc_size;
  char **newKeys;
  int result;
  MAP_HANDLE_DATA *handleData_local;
  
  if (handleData->count < 0xfffffffffffffffe) {
    local_58 = handleData->count + 1;
  }
  else {
    local_58 = 0xffffffffffffffff;
  }
  if (local_58 == 0) {
    local_60 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_58;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 8) {
      local_68 = 0xffffffffffffffff;
    }
    else {
      local_68 = local_58 << 3;
    }
    local_60 = local_68;
  }
  if ((local_60 == 0xffffffffffffffff) ||
     (ppcVar4 = (char **)realloc(handleData->keys,local_60), ppcVar4 == (char **)0x0)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/map.c"
                ,"Map_IncreaseStorageKeysValues",0xac,1,"realloc error, size:%zu",local_60);
    }
    newKeys._4_4_ = 0xad;
  }
  else {
    handleData->keys = ppcVar4;
    handleData->keys[handleData->count] = (char *)0x0;
    if (handleData->count < 0xfffffffffffffffe) {
      local_70 = handleData->count + 1;
    }
    else {
      local_70 = 0xffffffffffffffff;
    }
    if (local_70 == 0) {
      local_78 = 0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_70;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < 8) {
        local_80 = 0xffffffffffffffff;
      }
      else {
        local_80 = local_70 << 3;
      }
      local_78 = local_80;
    }
    if ((local_78 == 0xffffffffffffffff) ||
       (ppcVar4 = (char **)realloc(handleData->values,local_78), ppcVar4 == (char **)0x0)) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/map.c"
                  ,"Map_IncreaseStorageKeysValues",0xb9,1,"realloc error, size:%zu",local_78);
      }
      if (handleData->count == 0) {
        free(handleData->keys);
        handleData->keys = (char **)0x0;
      }
      else {
        if (handleData->count == 0) {
          local_88 = 0;
        }
        else {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = handleData->count;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) < 8) {
            local_90 = 0xffffffffffffffff;
          }
          else {
            local_90 = handleData->count << 3;
          }
          local_88 = local_90;
        }
        if ((local_88 == 0xffffffffffffffff) ||
           (ppcVar4 = (char **)realloc(handleData->keys,local_88), ppcVar4 == (char **)0x0)) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/src/map.c"
                      ,"Map_IncreaseStorageKeysValues",0xc6,1,
                      "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu"
                      ,local_88);
          }
        }
        else {
          handleData->keys = ppcVar4;
        }
      }
      newKeys._4_4_ = 0xcd;
    }
    else {
      handleData->values = ppcVar4;
      handleData->values[handleData->count] = (char *)0x0;
      handleData->count = handleData->count + 1;
      newKeys._4_4_ = 0;
    }
  }
  return newKeys._4_4_;
}

Assistant:

static int Map_IncreaseStorageKeysValues(MAP_HANDLE_DATA* handleData)
{
    int result;
    char** newKeys;
    size_t realloc_size = safe_add_size_t(handleData->count, 1);
    realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));
    if (realloc_size == SIZE_MAX ||
        (newKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
    {
        LogError("realloc error, size:%zu", realloc_size);
        result = MU_FAILURE;
    }
    else
    {
        char** newValues;
        handleData->keys = newKeys;
        handleData->keys[handleData->count] = NULL;
        realloc_size = safe_add_size_t(handleData->count, 1);
        realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));
        if (realloc_size == SIZE_MAX ||
            (newValues = (char**)realloc(handleData->values, realloc_size)) == NULL)
        {
            LogError("realloc error, size:%zu", realloc_size);
            if (handleData->count == 0) /*avoiding an implementation defined behavior */
            {
                free(handleData->keys);
                handleData->keys = NULL;
            }
            else
            {
                char** undoneKeys;
                realloc_size = safe_multiply_size_t((handleData->count), sizeof(char*));
                if (realloc_size == SIZE_MAX ||
                    (undoneKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
                {
                    LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
                }
                else
                {
                    handleData->keys = undoneKeys;
                }
            }
            result = MU_FAILURE;
        }
        else
        {
            handleData->values = newValues;
            handleData->values[handleData->count] = NULL;
            handleData->count++;
            result = 0;
        }
    }
    return result;
}